

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O3

ASN1_VALUE * ASN1_item_d2i(ASN1_VALUE **val,uchar **in,long len,ASN1_ITEM *it)

{
  int iVar1;
  ASN1_VALUE *ret;
  
  ret = (ASN1_VALUE *)0x0;
  iVar1 = asn1_item_ex_d2i(&ret,in,len,(ASN1_ITEM *)it,-1,0,'\0',(CRYPTO_BUFFER *)0x0,0);
  if (iVar1 < 1) {
    ASN1_item_ex_free((ASN1_VALUE **)&ret,it);
  }
  if (val != (ASN1_VALUE **)0x0) {
    ASN1_item_ex_free(val,it);
    *val = (ASN1_VALUE *)ret;
  }
  return (ASN1_VALUE *)ret;
}

Assistant:

ASN1_VALUE *ASN1_item_d2i(ASN1_VALUE **pval, const unsigned char **in, long len,
                          const ASN1_ITEM *it) {
  ASN1_VALUE *ret = NULL;
  if (asn1_item_ex_d2i(&ret, in, len, it, /*tag=*/-1, /*aclass=*/0, /*opt=*/0,
                       /*buf=*/NULL, /*depth=*/0) <= 0) {
    // Clean up, in case the caller left a partial object.
    //
    // TODO(davidben): I don't think it can leave one, but the codepaths below
    // are a bit inconsistent. Revisit this when rewriting this function.
    ASN1_item_ex_free(&ret, it);
  }

  // If the caller supplied an output pointer, free the old one and replace it
  // with |ret|. This differs from OpenSSL slightly in that we don't support
  // object reuse. We run this on both success and failure. On failure, even
  // with object reuse, OpenSSL destroys the previous object.
  if (pval != NULL) {
    ASN1_item_ex_free(pval, it);
    *pval = ret;
  }
  return ret;
}